

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O2

int Abc_CommandOrder(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  Abc_Ntk_t *pNtk;
  FILE *__stream;
  char *pcVar2;
  uint fVerbose;
  uint fReverse;
  char *pcVar3;
  
  pNtk = Abc_FrameReadNtk(pAbc);
  fReverse = 0;
  Extra_UtilGetoptReset();
  fVerbose = 0;
  while( true ) {
    while (iVar1 = Extra_UtilGetopt(argc,argv,"rvh"), iVar1 == 0x76) {
      fVerbose = fVerbose ^ 1;
    }
    if (iVar1 == -1) break;
    if (iVar1 != 0x72) {
      iVar1 = -2;
      Abc_Print(-2,"usage: order [-rvh] <file>\n");
      Abc_Print(-2,"\t         computes a good static CI variable order\n");
      pcVar3 = "yes";
      pcVar2 = "yes";
      if (fReverse == 0) {
        pcVar2 = "no";
      }
      Abc_Print(-2,"\t-r     : toggle reverse ordering [default = %s]\n",pcVar2);
      if (fVerbose == 0) {
        pcVar3 = "no";
      }
      Abc_Print(-2,"\t-v     : prints verbose information [default = %s]\n",pcVar3);
      Abc_Print(-2,"\t-h     : print the command usage\n");
      pcVar2 = "\t<file> : (optional) file with the given variable order\n";
LAB_001f06bf:
      Abc_Print(iVar1,pcVar2);
      return 1;
    }
    fReverse = fReverse ^ 1;
  }
  if (pNtk != (Abc_Ntk_t *)0x0) {
    if (globalUtilOptind + 1 == argc) {
      pcVar2 = argv[globalUtilOptind];
      __stream = fopen(pcVar2,"r");
      if (__stream == (FILE *)0x0) {
        Abc_Print(-1,"Cannot open file \"%s\" with the BDD variable order.\n",pcVar2);
        return 1;
      }
      fclose(__stream);
      if (pcVar2 != (char *)0x0) {
        Abc_NtkImplementCiOrder(pNtk,pcVar2,fReverse,fVerbose);
        return 0;
      }
    }
    Abc_NtkFindCiOrder(pNtk,fReverse,fVerbose);
    return 0;
  }
  pcVar2 = "Empty network.\n";
  iVar1 = -1;
  goto LAB_001f06bf;
}

Assistant:

int Abc_CommandOrder( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    FILE * pFile;
    Abc_Ntk_t * pNtk = Abc_FrameReadNtk(pAbc);
    char * pFileName;
    int c;
    int fReverse;
    int fVerbose;
    extern void Abc_NtkImplementCiOrder( Abc_Ntk_t * pNtk, char * pFileName, int fReverse, int fVerbose );
    extern void Abc_NtkFindCiOrder( Abc_Ntk_t * pNtk, int fReverse, int fVerbose );

    // set defaults
    fReverse = 0;
    fVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "rvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'r':
            fReverse ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }

    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }
//    if ( Abc_NtkLatchNum(pNtk) > 0 )
//    {
//        Abc_Print( -1, "Currently this procedure does not work for sequential networks.\n" );
//        return 1;
//    }

    // if the var order file is given, implement this order
    pFileName = NULL;
    if ( argc == globalUtilOptind + 1 )
    {
        pFileName = argv[globalUtilOptind];
        pFile = fopen( pFileName, "r" );
        if ( pFile == NULL )
        {
            Abc_Print( -1, "Cannot open file \"%s\" with the BDD variable order.\n", pFileName );
            return 1;
        }
        fclose( pFile );
    }
    if ( pFileName )
        Abc_NtkImplementCiOrder( pNtk, pFileName, fReverse, fVerbose );
    else
        Abc_NtkFindCiOrder( pNtk, fReverse, fVerbose );
    return 0;

usage:
    Abc_Print( -2, "usage: order [-rvh] <file>\n" );
    Abc_Print( -2, "\t         computes a good static CI variable order\n" );
    Abc_Print( -2, "\t-r     : toggle reverse ordering [default = %s]\n", fReverse? "yes": "no" );
    Abc_Print( -2, "\t-v     : prints verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    Abc_Print( -2, "\t<file> : (optional) file with the given variable order\n" );
    return 1;
}